

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.h
# Opt level: O0

type dlib::
     directory_helper_get_dirs<dlib::queue_kernel_c<dlib::queue_kernel_1<dlib::directory,dlib::memory_manager_stateless_kernel_1<char>>>>
               (data *state,
               queue_kernel_c<dlib::queue_kernel_1<dlib::directory,_dlib::memory_manager_stateless_kernel_1<char>_>_>
               *dirs)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  DIR *__rhs;
  int *piVar8;
  long in_RDI;
  directory temp;
  string dtemp;
  string path;
  stat64 buffer;
  dirent *data;
  DIR *ffind;
  string *in_stack_fffffffffffffd78;
  queue_kernel_1<dlib::directory,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_stack_fffffffffffffd80;
  allocator *item;
  undefined4 in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  undefined7 in_stack_fffffffffffffdc8;
  char in_stack_fffffffffffffdcf;
  string local_200 [32];
  directory local_1e0;
  allocator local_199;
  string local_198 [32];
  string local_178 [39];
  undefined1 local_151;
  undefined1 local_129;
  string local_108 [32];
  stat64 local_e8;
  dirent *local_58;
  DIR *local_50;
  undefined1 local_45;
  allocator local_31;
  string local_30 [40];
  long local_8;
  
  local_8 = in_RDI;
  queue_kernel_1<dlib::directory,_dlib::memory_manager_stateless_kernel_1<char>_>::clear
            (in_stack_fffffffffffffd80);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 == 0) {
    local_45 = 1;
    uVar6 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_30,"This directory object currently doesn\'t represent any directory.",
               &local_31);
    directory::listing_error::listing_error
              ((listing_error *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    local_45 = 0;
    __cxa_throw(uVar6,&directory::listing_error::typeinfo,directory::listing_error::~listing_error);
  }
  local_50 = (DIR *)0x0;
  std::__cxx11::string::string(local_108,(string *)(local_8 + 0x20));
  std::__cxx11::string::size();
  pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_108);
  cVar1 = *pcVar7;
  cVar2 = directory::get_separator();
  if (cVar1 != cVar2) {
    in_stack_fffffffffffffdcf = directory::get_separator();
    std::__cxx11::string::operator+=(local_108,in_stack_fffffffffffffdcf);
  }
  pcVar7 = (char *)std::__cxx11::string::c_str();
  __rhs = opendir(pcVar7);
  local_50 = __rhs;
  if (__rhs == (DIR *)0x0) {
    local_129 = 1;
    uVar6 = __cxa_allocate_exception(0x30);
    std::operator+((char *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    directory::listing_error::listing_error
              ((listing_error *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    local_129 = 0;
    __cxa_throw(uVar6,&directory::listing_error::typeinfo,directory::listing_error::~listing_error);
  }
  while( true ) {
    piVar8 = __errno_location();
    *piVar8 = 0;
    local_58 = readdir(local_50);
    if (local_58 == (dirent *)0x0) break;
    std::operator+(in_stack_fffffffffffffda8,
                   (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    pcVar7 = (char *)std::__cxx11::string::c_str();
    in_stack_fffffffffffffda4 = stat64(pcVar7,&local_e8);
    std::__cxx11::string::~string(local_178);
    if (in_stack_fffffffffffffda4 == 0) {
      pcVar7 = local_58->d_name;
      item = &local_199;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_198,pcVar7,item);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
      if ((((local_e8.st_mode & 0xf000) == 0x4000) &&
          (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78),
          bVar3)) &&
         (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78),
         bVar3)) {
        std::operator+(in_stack_fffffffffffffda8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
        directory::directory(&local_1e0,local_198,local_200);
        std::__cxx11::string::~string(local_200);
        queue_kernel_1<dlib::directory,_dlib::memory_manager_stateless_kernel_1<char>_>::enqueue
                  ((queue_kernel_1<dlib::directory,_dlib::memory_manager_stateless_kernel_1<char>_>
                    *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (directory *)item);
        directory::~directory((directory *)0x486e3f);
      }
      std::__cxx11::string::~string(local_198);
    }
  }
  piVar8 = __errno_location();
  if (*piVar8 != 0) {
    local_151 = 1;
    uVar6 = __cxa_allocate_exception(0x30);
    std::operator+((char *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    directory::listing_error::listing_error
              ((listing_error *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    local_151 = 0;
    __cxa_throw(uVar6,&directory::listing_error::typeinfo,directory::listing_error::~listing_error);
  }
  if (local_50 != (DIR *)0x0) {
    do {
      iVar4 = closedir(local_50);
      if (iVar4 == 0) break;
      piVar8 = __errno_location();
    } while (*piVar8 == 4);
    local_50 = (DIR *)0x0;
  }
  std::__cxx11::string::~string(local_108);
  return;
}

Assistant:

typename disable_if<is_std_vector<queue_of_dirs>,void>::type 
    directory_helper_get_dirs (
        const directory::data& state,
        queue_of_dirs& dirs
    ) 
    {
        using namespace std;

        dirs.clear();
        if (state.full_name.size() == 0)
            throw directory::listing_error("This directory object currently doesn't represent any directory.");

        DIR* ffind = 0;
        struct dirent* data;
        struct stat64 buffer;

        try
        {
            string path = state.full_name;
            // ensure that the path ends with a separator
            if (path[path.size()-1] != directory::get_separator())
                path += directory::get_separator();

            // get a handle to something we can search with
            ffind = opendir(state.full_name.c_str());
            if (ffind == 0)
            {
                throw directory::listing_error("Unable to list the contents of " + state.full_name);
            }

            while(true)
            {
                errno = 0;
                if ( (data = readdir(ffind)) == 0)
                {                    
                    // there was an error or no more files
                    if ( errno == 0)
                    {
                        // there are no more files
                        break;
                    }
                    else
                    {
                        // there was an error
                        throw directory::listing_error("Unable to list the contents of " + state.full_name);
                    }                
                }

                // get a stat64 structure so we can see if this is a file
                if (::stat64((path+data->d_name).c_str(), &buffer) != 0)
                {
                    // just assume this isn't a directory.  It is probably a broken
                    // symbolic link.
                    continue;
                }

                string dtemp(data->d_name);
                if (S_ISDIR(buffer.st_mode) &&
                    dtemp != "." &&
                    dtemp != ".." )
                {
                    // this is a directory so add it to dirs
                    directory temp(dtemp,path+dtemp, directory::private_constructor());
                    dirs.enqueue(temp);
                }
            } // while (true)

            if (ffind != 0)
            {
                while (closedir(ffind))
                {
                    if (errno != EINTR)
                        break;
                }
                ffind = 0;
            }

        }
        catch (...)
        {
            if (ffind != 0)
            {
                while (closedir(ffind))
                {
                    if (errno != EINTR)
                        break;
                }
                ffind = 0;
            }
            dirs.clear();
            throw;
        }
    }